

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int in_ECX;
  TString *in_RDX;
  TString *in_RSI;
  TString *in_RDI;
  int v;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == (TString *)0x0) {
    init_exp((expdesc *)&in_RDX->tsv,VGLOBAL,0xff);
    iVar1 = 8;
  }
  else {
    iVar1 = searchvar((FuncState *)&in_RDI->tsv,in_RSI);
    if (iVar1 < 0) {
      iVar1 = singlevaraux((FuncState *)&in_RSI->tsv,in_RDX,(expdesc *)CONCAT44(in_ECX,iVar1),0);
      if (iVar1 == 8) {
        iVar1 = 8;
      }
      else {
        iVar1 = indexupvalue((FuncState *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             (expdesc *)&in_RSI->tsv);
        *(char *)((long)in_RDX + 8) = (char)iVar1;
        *(char *)((long)in_RDX + 9) = (char)((uint)iVar1 >> 8);
        *(char *)((long)in_RDX + 10) = (char)((uint)iVar1 >> 0x10);
        *(char *)((long)in_RDX + 0xb) = (char)((uint)iVar1 >> 0x18);
        *(undefined4 *)in_RDX = 7;
        iVar1 = 7;
      }
    }
    else {
      init_exp((expdesc *)&in_RDX->tsv,VLOCAL,iVar1);
      if (in_ECX == 0) {
        markupval((FuncState *)&in_RDI->tsv,iVar1);
      }
      iVar1 = 6;
    }
  }
  return iVar1;
}

Assistant:

static int singlevaraux(FuncState*fs,TString*n,expdesc*var,int base){
if(fs==NULL){
init_exp(var,VGLOBAL,((1<<8)-1));
return VGLOBAL;
}
else{
int v=searchvar(fs,n);
if(v>=0){
init_exp(var,VLOCAL,v);
if(!base)
markupval(fs,v);
return VLOCAL;
}
else{
if(singlevaraux(fs->prev,n,var,0)==VGLOBAL)
return VGLOBAL;
var->u.s.info=indexupvalue(fs,n,var);
var->k=VUPVAL;
return VUPVAL;
}
}
}